

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_lib.cc
# Opt level: O2

void __thiscall
bssl::DTLSTimer::StartMicroseconds(DTLSTimer *this,OPENSSL_timeval now,uint64_t microseconds)

{
  undefined1 auVar1 [16];
  int iVar2;
  uint64_t uVar3;
  ulong uVar4;
  uint32_t uVar5;
  uint uVar6;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = microseconds;
  iVar2 = SUB164(auVar1 % ZEXT816(1000000),0);
  uVar6 = iVar2 + now.tv_usec;
  uVar4 = (microseconds / 1000000 + 1) - (ulong)(uVar6 < 1000000);
  uVar5 = iVar2 + -1000000 + now.tv_usec;
  if (uVar6 < 1000000) {
    uVar5 = uVar6;
  }
  uVar3 = uVar4 + now.tv_sec;
  if (CARRY8(uVar4,now.tv_sec)) {
    uVar5 = 0;
    uVar3 = 0;
  }
  (this->expire_time_).tv_sec = uVar3;
  (this->expire_time_).tv_usec = uVar5;
  return;
}

Assistant:

void DTLSTimer::StartMicroseconds(OPENSSL_timeval now, uint64_t microseconds) {
  uint64_t seconds = microseconds / 1000000;
  microseconds %= 1000000;

  now.tv_usec += microseconds;
  if (now.tv_usec >= 1000000) {
    now.tv_usec -= 1000000;
    seconds++;
  }

  if (now.tv_sec > UINT64_MAX - seconds) {
    Stop();
    return;
  }
  now.tv_sec += seconds;
  expire_time_ = now;
}